

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_parser.cc
# Opt level: O0

void __thiscall
xsettingsd::ConfigParser::FileCharStream::FileCharStream(FileCharStream *this,string *filename)

{
  string *filename_local;
  FileCharStream *this_local;
  
  CharStream::CharStream(&this->super_CharStream);
  (this->super_CharStream)._vptr_CharStream = (_func_int **)&PTR__FileCharStream_00114bb0;
  std::__cxx11::string::string((string *)&this->filename_,(string *)filename);
  this->file_ = (FILE *)0x0;
  return;
}

Assistant:

ConfigParser::FileCharStream::FileCharStream(const string& filename)
    : filename_(filename),
      file_(NULL) {
}